

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O2

char16 * __thiscall Js::LazyJSONString::GetSz(LazyJSONString *this)

{
  bool bVar1;
  charcount_t bufferLength;
  char16 *pcVar2;
  Recycler *this_00;
  char16_t *buffer;
  undefined1 local_58 [8];
  JSONStringBuilder builder;
  
  bVar1 = JavascriptString::IsFinalized(&this->super_JavascriptString);
  if (bVar1) {
    pcVar2 = JavascriptString::UnsafeGetBuffer(&this->super_JavascriptString);
    return pcVar2;
  }
  bufferLength = JavascriptString::SafeSzSize(&this->super_JavascriptString);
  local_58 = (undefined1  [8])&char16_t::typeinfo;
  builder.scriptContext = (ScriptContext *)0x0;
  builder.currentLocation =
       L"/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/LazyJSONString.cpp"
  ;
  builder.jsonContent._0_4_ = 0xbb;
  builder.endLocation = (char16 *)(ulong)bufferLength;
  this_00 = Memory::Recycler::TrackAllocInfo
                      (((((((this->super_JavascriptString).super_RecyclableObject.type.ptr)->
                          javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                       recycler,(TrackAllocData *)local_58);
  buffer = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                     ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,
                      (size_t)(ulong)bufferLength);
  JSONStringBuilder::JSONStringBuilder
            ((JSONStringBuilder *)local_58,
             (((((this->super_JavascriptString).super_RecyclableObject.type.ptr)->javascriptLibrary)
              .ptr)->super_JavascriptLibraryBase).scriptContext.ptr,(this->jsonContent).ptr,buffer,
             bufferLength,(this->gap).ptr,*(charcount_t *)&(this->super_JavascriptString).field_0x1c
            );
  JSONStringBuilder::Build((JSONStringBuilder *)local_58);
  JavascriptString::SetBuffer(&this->super_JavascriptString,buffer);
  (this->jsonContent).ptr = (JSONProperty *)0x0;
  return buffer;
}

Assistant:

const char16*
LazyJSONString::GetSz()
{
    if (this->IsFinalized())
    {
        return this->UnsafeGetBuffer();
    }

    const charcount_t allocSize = this->SafeSzSize();

    Recycler* recycler = GetScriptContext()->GetRecycler();
    char16* target = RecyclerNewArrayLeaf(recycler, char16, allocSize);

    JSONStringBuilder builder(
        this->GetScriptContext(),
        this->jsonContent,
        target,
        allocSize,
        this->gap,
        this->gapLength);

    builder.Build();

    this->SetBuffer(target);

    // You probably aren't going to parse if you are using the string buffer
    // Let's throw away the metadata so we can reclaim the memory
    this->jsonContent = nullptr;

    return target;
}